

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

void __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this)

{
  return;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
#if __AVX2__
    if (opt.use_weight_fp16_storage)
    {
        ncnn::cast_float32_to_float16(weight_xc_data, weight_xc_data_fp16, opt);
        ncnn::cast_float32_to_float16(weight_hc_data, weight_hc_data_fp16, opt);
    }
#else
    (void)(opt);
#endif // __AVX__

    return 0;
}